

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

PropertyBase *
Protocol::MQTT::V5::TypedProperty<(Protocol::MQTT::V5::PropertyType)42,_unsigned_char>::allocateProp
          (void)

{
  Property<unsigned_char> *this;
  
  this = (Property<unsigned_char> *)operator_new(0x38);
  Property<unsigned_char>::Property(this,SharedSubAvailable,'\0',true);
  return (PropertyBase *)this;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }